

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

void __thiscall cs::compiler_type::try_fix_this_deduction(compiler_type *this,iterator it)

{
  token_base *ptVar1;
  int iVar2;
  token_base **pptVar3;
  iterator iVar4;
  compile_error *this_00;
  long *plVar5;
  tree_node *ptVar6;
  iterator local_a8;
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  iterator local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  iterator local_38;
  iterator local_30;
  
  if (it.mData != (tree_node *)0x0) {
    local_a8.mData = it.mData;
    pptVar3 = tree_type<cs::token_base_*>::iterator::data(&local_a8);
    ptVar1 = *pptVar3;
    if (((ptVar1 != (token_base *)0x0) &&
        (ptVar1->_vptr_token_base == (_func_int **)&PTR__token_base_0032a5d0)) &&
       (*(int *)&ptVar1[1]._vptr_token_base == 0xe)) {
      local_80._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_a8);
      pptVar3 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_80);
      ptVar1 = *pptVar3;
      if ((ptVar1 != (token_base *)0x0) &&
         (ptVar1->_vptr_token_base == (_func_int **)&PTR__token_id_0032a8b0)) {
        iVar2 = std::__cxx11::string::compare((char *)(ptVar1 + 3));
        if (iVar2 == 0) {
          local_80._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_a8);
          iVar4 = tree_type<cs::token_base_*>::iterator::left((iterator *)local_80);
          if (iVar4.mData != (tree_node *)0x0) {
            local_a0._0_8_ = tree_type<cs::token_base_*>::iterator::left(&local_a8);
            local_58._M_dataplus._M_p =
                 (pointer)tree_type<cs::token_base_*>::iterator::left((iterator *)local_a0);
            pptVar3 = tree_type<cs::token_base_*>::iterator::data((iterator *)&local_58);
            if (*pptVar3 != (token_base *)0x0) {
              local_30 = tree_type<cs::token_base_*>::iterator::left(&local_a8);
              local_60 = tree_type<cs::token_base_*>::iterator::left(&local_30);
              pptVar3 = tree_type<cs::token_base_*>::iterator::data(&local_60);
              ptVar1 = *pptVar3;
              local_38 = tree_type<cs::token_base_*>::iterator::right(&local_a8);
              pptVar3 = tree_type<cs::token_base_*>::iterator::data(&local_38);
              if (ptVar1 == *pptVar3) {
                this_00 = (compile_error *)__cxa_allocate_exception(0x28);
                local_a0._0_8_ = local_a0 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_a0,"Symbol collision with structure member \"","");
                local_60 = tree_type<cs::token_base_*>::iterator::right(&local_a8);
                pptVar3 = tree_type<cs::token_base_*>::iterator::data(&local_60);
                std::operator+(&local_58,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(*pptVar3 + 3));
                plVar5 = (long *)std::__cxx11::string::append((char *)&local_58);
                local_80._0_8_ = *plVar5;
                ptVar6 = (tree_node *)(plVar5 + 2);
                if ((tree_node *)local_80._0_8_ == ptVar6) {
                  local_80._16_8_ = ptVar6->root;
                  local_80._24_8_ = plVar5[3];
                  local_80._0_8_ = (tree_node *)(local_80 + 0x10);
                }
                else {
                  local_80._16_8_ = ptVar6->root;
                }
                local_80._8_8_ = plVar5[1];
                *plVar5 = (long)ptVar6;
                plVar5[1] = 0;
                *(undefined1 *)(plVar5 + 2) = 0;
                compile_error::compile_error(this_00,(string *)local_80);
                __cxa_throw(this_00,&compile_error::typeinfo,compile_error::~compile_error);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void compiler_type::try_fix_this_deduction(cs::tree_type<cs::token_base *>::iterator it)
	{
		if (!it.usable())
			return;
		token_signal *sig = dynamic_cast<token_signal *>(it.data());
		if (sig == nullptr || sig->get_signal() != signal_types::dot_)
			return;
		token_id *id = dynamic_cast<token_id *>(it.left().data());
		if (id == nullptr || id->get_id().get_id() != "this")
			return;
		// Check if it was generated by AST trimmer
		if (it.left().left().usable() && it.left().left().data() != nullptr &&
		        it.left().left().data() == it.right().data()) {
			// it.data() = it.right().data();
			throw compile_error(std::string("Symbol collision with structure member \"") +
			                    static_cast<token_id *>(it.right().data())->get_id().get_id() + "\".");
		}
	}